

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

l_mem propagatemark(global_State *g)

{
  lu_byte *plVar1;
  byte *pbVar2;
  uint uVar3;
  GCObject *L;
  TString *pTVar4;
  global_State *pgVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  TValue *pTVar10;
  char *pcVar11;
  char *pcVar12;
  Table *pTVar13;
  undefined1 *puVar14;
  ulong uVar15;
  Table **ppTVar16;
  CallInfo *pCVar17;
  long lVar18;
  lua_State *th;
  GCObject *pGVar19;
  TValue **__s;
  Table *pTVar20;
  int *piVar21;
  long lVar22;
  bool bVar23;
  Table *pTVar24;
  GCObject **ppGVar25;
  long lVar26;
  bool bVar27;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  
  L = g->gray;
  (L->gch).marked = (L->gch).marked | 4;
  uVar15 = 0;
  switch((L->gch).tt) {
  case '\x05':
    g->gray = (L->h).gclist;
    pGVar19 = (GCObject *)(L->h).metatable;
    if (pGVar19 == (GCObject *)0x0) {
LAB_0010898c:
      bVar27 = false;
LAB_0010898e:
      lVar22 = (long)(L->h).sizearray;
      if (lVar22 == 0) {
        bVar23 = false;
      }
      else {
        lVar26 = lVar22 * 0x10 + -8;
        do {
          if ((3 < *(int *)((long)&((L->h).array)->value + lVar26)) &&
             (pGVar19 = *(GCObject **)((long)(L->h).array + lVar26 + -8),
             ((pGVar19->gch).marked & 3) != 0)) {
            reallymarkobject(g,pGVar19);
          }
          lVar22 = lVar22 + -1;
          lVar26 = lVar26 + -0x10;
        } while (lVar22 != 0);
        bVar23 = false;
      }
LAB_00108a38:
      if ((L->h).lsizenode < 0x20) {
        lVar26 = (0x100000000 << ((L->h).lsizenode & 0x3f)) >> 0x20;
        lVar22 = lVar26 * 0x28 + -0x10;
        do {
          pgVar5 = (global_State *)(L->h).node;
          if (*(int *)((long)pgVar5 + lVar22 + -0x10) == 0) {
            if (3 < *(int *)((long)&(pgVar5->strt).hash + lVar22)) {
              *(undefined4 *)((long)&(pgVar5->strt).hash + lVar22) = 0xb;
            }
          }
          else {
            if (((!bVar27) && (3 < *(int *)((long)&(pgVar5->strt).hash + lVar22))) &&
               (pGVar19 = *(GCObject **)((long)pgVar5 + lVar22 + -8),
               ((pGVar19->gch).marked & 3) != 0)) {
              reallymarkobject(g,pGVar19);
            }
            if (((!bVar23) && (3 < *(int *)((long)pgVar5 + lVar22 + -0x10))) &&
               (pGVar19 = *(GCObject **)((long)pgVar5 + lVar22 + -0x18),
               ((pGVar19->gch).marked & 3) != 0)) {
              reallymarkobject(g,pGVar19);
            }
          }
          lVar26 = lVar26 + -1;
          lVar22 = lVar22 + -0x28;
        } while (lVar26 != 0);
      }
      if ((bool)(bVar27 | bVar23)) goto LAB_00108ae4;
    }
    else {
      if (((pGVar19->gch).marked & 3) != 0) {
        reallymarkobject(g,pGVar19);
        pGVar19 = (GCObject *)(L->h).metatable;
        if (pGVar19 == (GCObject *)0x0) goto LAB_0010898c;
      }
      if (((((pGVar19->h).flags & 8) != 0) ||
          (pTVar10 = luaT_gettm(&pGVar19->h,TM_MODE,g->tmname[3]), pTVar10 == (TValue *)0x0)) ||
         (pTVar10->tt != 4)) goto LAB_0010898c;
      __s = &(((pTVar10->value).gc)->h).array;
      pcVar11 = strchr((char *)__s,0x6b);
      bVar27 = pcVar11 != (char *)0x0;
      pcVar12 = strchr((char *)__s,0x76);
      if (pcVar11 == (char *)0x0 && pcVar12 == (char *)0x0) goto LAB_0010898c;
      (L->gch).marked =
           (pcVar12 != (char *)0x0) << 4 | (pcVar11 != (char *)0x0) * '\b' | (L->gch).marked & 0xe7;
      (L->h).gclist = g->weak;
      g->weak = L;
      if (pcVar11 == (char *)0x0 || pcVar12 == (char *)0x0) {
        bVar23 = true;
        if (pcVar12 == (char *)0x0) goto LAB_0010898e;
        goto LAB_00108a38;
      }
LAB_00108ae4:
      (L->gch).marked = (L->gch).marked & 0xfb;
    }
    uVar15 = (long)(L->h).sizearray * 0x10 + (0x28L << ((L->h).lsizenode & 0x3f)) + 0x40;
    break;
  case '\x06':
    g->gray = (GCObject *)(L->h).metatable;
    if (((((GCObject *)(L->h).array)->gch).marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)(L->h).array);
    }
    if ((L->h).flags == '\0') {
      if (((((GCObject *)(L->h).node)->gch).marked & 3) != 0) {
        reallymarkobject(g,(GCObject *)(L->h).node);
      }
      bVar9 = (L->h).lsizenode;
      if (bVar9 == 0) goto LAB_00108a18;
      uVar15 = 0;
      do {
        pGVar19 = *(GCObject **)((long)L + uVar15 * 8 + 0x28);
        if (((pGVar19->gch).marked & 3) != 0) {
          reallymarkobject(g,pGVar19);
          bVar9 = (L->h).lsizenode;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < bVar9);
    }
    else {
      bVar9 = (L->h).lsizenode;
      if (bVar9 == 0) {
LAB_00108a18:
        bVar9 = 0;
      }
      else {
        ppGVar25 = &(L->h).gclist;
        uVar15 = 0;
        do {
          if ((3 < *(int *)ppGVar25) && (((ppGVar25[-1]->gch).marked & 3) != 0)) {
            reallymarkobject(g,ppGVar25[-1]);
            bVar9 = (L->h).lsizenode;
          }
          uVar15 = uVar15 + 1;
          ppGVar25 = ppGVar25 + 2;
        } while (uVar15 < bVar9);
      }
    }
    uVar15 = (ulong)(((uint)bVar9 << (4U - ((L->h).flags == '\0') & 0x1f)) + 0x28 & 0xfff8);
    break;
  case '\b':
    g->gray = (L->th).gclist;
    (L->th).gclist = g->grayagain;
    g->grayagain = L;
    (L->gch).marked = (L->gch).marked & 0xfb;
    if ((3 < (L->th).l_gt.tt) && (pGVar19 = (L->th).l_gt.value.gc, ((pGVar19->gch).marked & 3) != 0)
       ) {
      reallymarkobject(g,pGVar19);
    }
    pTVar13 = (L->h).metatable;
    pTVar24 = pTVar13;
    for (pCVar17 = (L->th).base_ci; pCVar17 <= (CallInfo *)(L->h).lastfree; pCVar17 = pCVar17 + 1) {
      if (pTVar24 < (Table *)pCVar17->top) {
        pTVar24 = (Table *)pCVar17->top;
      }
    }
    for (pTVar20 = (Table *)(L->th).stack; auVar8 = _DAT_00115030, auVar7 = _DAT_00115020,
        auVar6 = _DAT_00115010, pTVar20 < pTVar13; pTVar20 = (Table *)&pTVar20->metatable) {
      if ((3 < *(int *)&pTVar20->tt) && (((((Value *)&pTVar20->next)->gc->gch).marked & 3) != 0)) {
        reallymarkobject(g,((Value *)&pTVar20->next)->gc);
        pTVar13 = (L->h).metatable;
      }
    }
    if (pTVar20 <= pTVar24) {
      ppTVar16 = (Table **)((long)&pTVar24->next + 1);
      if (ppTVar16 < &pTVar20->metatable) {
        ppTVar16 = &pTVar20->metatable;
      }
      puVar14 = (undefined1 *)((long)ppTVar16 + ~(ulong)pTVar20);
      auVar31._8_4_ = (int)puVar14;
      auVar31._0_8_ = puVar14;
      auVar31._12_4_ = (int)((ulong)puVar14 >> 0x20);
      auVar28._0_8_ = (ulong)puVar14 >> 4;
      auVar28._8_8_ = auVar31._8_8_ >> 4;
      piVar21 = &pTVar20->sizearray;
      uVar15 = 0;
      auVar28 = auVar28 ^ _DAT_00115030;
      do {
        auVar30._8_4_ = (int)uVar15;
        auVar30._0_8_ = uVar15;
        auVar30._12_4_ = (int)(uVar15 >> 0x20);
        auVar31 = (auVar30 | auVar7) ^ auVar8;
        iVar29 = auVar28._4_4_;
        if ((bool)(~(auVar31._4_4_ == iVar29 && auVar28._0_4_ < auVar31._0_4_ ||
                    iVar29 < auVar31._4_4_) & 1)) {
          piVar21[-0xc] = 0;
        }
        if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
            auVar31._12_4_ <= auVar28._12_4_) {
          piVar21[-8] = 0;
        }
        auVar31 = (auVar30 | auVar6) ^ auVar8;
        iVar32 = auVar31._4_4_;
        if (iVar32 <= iVar29 && (iVar32 != iVar29 || auVar31._0_4_ <= auVar28._0_4_)) {
          piVar21[-4] = 0;
          *piVar21 = 0;
        }
        uVar15 = uVar15 + 4;
        piVar21 = piVar21 + 0x10;
      } while ((((ulong)puVar14 >> 4) + 4 & 0xfffffffffffffffc) != uVar15);
    }
    uVar3 = (L->p).sizelocvars;
    if ((int)uVar3 < 0x4e21) {
      pTVar4 = (L->p).source;
      if ((0x10 < (int)uVar3) &&
         ((int)((ulong)((long)(L->h).lastfree - (long)(L->th).base_ci) >> 3) * 0x33333334 <
          (int)uVar3)) {
        luaD_reallocCI(&L->th,uVar3 >> 1);
      }
      uVar3 = (L->p).sizep;
      if (0x5a < (int)uVar3 &&
          (int)((uint)((ulong)((long)pTVar24 - (long)pTVar4) >> 2) & 0xfffffffc) < (int)uVar3) {
        luaD_reallocstack(&L->th,uVar3 >> 1);
      }
    }
    uVar15 = (long)(L->p).sizep * 0x10 + (long)(L->p).sizelocvars * 0x28 + 0xb8;
    break;
  case '\t':
    g->gray = (L->p).gclist;
    if ((L->th).stack != (StkId)0x0) {
      pbVar2 = (byte *)((long)&((L->th).stack)->tt + 1);
      *pbVar2 = *pbVar2 & 0xfc;
    }
    iVar29 = (L->p).sizek;
    if (0 < iVar29) {
      lVar26 = 8;
      lVar22 = 0;
      do {
        if ((3 < *(int *)((long)&((L->h).metatable)->next + lVar26)) &&
           (pGVar19 = *(GCObject **)((long)(L->h).metatable + lVar26 + -8),
           ((pGVar19->gch).marked & 3) != 0)) {
          reallymarkobject(g,pGVar19);
          iVar29 = (L->p).sizek;
        }
        lVar22 = lVar22 + 1;
        lVar26 = lVar26 + 0x10;
      } while (lVar22 < iVar29);
    }
    iVar29 = (L->p).sizeupvalues;
    if (0 < iVar29) {
      lVar22 = 0;
      do {
        pGVar19 = (&((StkId)(L->p).upvalues)->value)[lVar22].gc;
        if (pGVar19 != (GCObject *)0x0) {
          plVar1 = &(pGVar19->gch).marked;
          *plVar1 = *plVar1 & 0xfc;
          iVar29 = (L->p).sizeupvalues;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar29);
    }
    iVar29 = (L->p).sizep;
    if (0 < iVar29) {
      lVar22 = 0;
      do {
        pGVar19 = (GCObject *)(&(((global_State *)(L->h).node)->strt).hash)[lVar22];
        if ((pGVar19 != (GCObject *)0x0) && (((pGVar19->gch).marked & 3) != 0)) {
          reallymarkobject(g,pGVar19);
          iVar29 = (L->p).sizep;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar29);
    }
    iVar32 = (L->p).sizelocvars;
    lVar22 = (long)iVar32;
    if (0 < lVar22) {
      lVar26 = 0;
      lVar18 = 0;
      do {
        lVar22 = *(long *)((long)(L->h).gclist + lVar26);
        if (lVar22 != 0) {
          pbVar2 = (byte *)(lVar22 + 9);
          *pbVar2 = *pbVar2 & 0xfc;
          iVar32 = (L->p).sizelocvars;
        }
        lVar18 = lVar18 + 1;
        lVar22 = (long)iVar32;
        lVar26 = lVar26 + 0x10;
      } while (lVar18 < lVar22);
      iVar29 = (L->p).sizep;
    }
    uVar15 = ((L->p).sizek + lVar22) * 0x10 +
             ((long)(L->p).sizelineinfo + (long)(L->p).sizecode) * 4 +
             ((long)(L->p).sizeupvalues + (long)iVar29) * 8 + 0x78;
  }
  return uVar15;
}

Assistant:

static l_mem propagatemark(global_State*g){
GCObject*o=g->gray;
gray2black(o);
switch(o->gch.tt){
case 5:{
Table*h=gco2h(o);
g->gray=h->gclist;
if(traversetable(g,h))
black2gray(o);
return sizeof(Table)+sizeof(TValue)*h->sizearray+
sizeof(Node)*sizenode(h);
}
case 6:{
Closure*cl=gco2cl(o);
g->gray=cl->c.gclist;
traverseclosure(g,cl);
return(cl->c.isC)?sizeCclosure(cl->c.nupvalues):
sizeLclosure(cl->l.nupvalues);
}
case 8:{
lua_State*th=gco2th(o);
g->gray=th->gclist;
th->gclist=g->grayagain;
g->grayagain=o;
black2gray(o);
traversestack(g,th);
return sizeof(lua_State)+sizeof(TValue)*th->stacksize+
sizeof(CallInfo)*th->size_ci;
}
case(8+1):{
Proto*p=gco2p(o);
g->gray=p->gclist;
traverseproto(g,p);
return sizeof(Proto)+sizeof(Instruction)*p->sizecode+
sizeof(Proto*)*p->sizep+
sizeof(TValue)*p->sizek+
sizeof(int)*p->sizelineinfo+
sizeof(LocVar)*p->sizelocvars+
sizeof(TString*)*p->sizeupvalues;
}
default:return 0;
}
}